

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O0

uint RDL_bitset_init(uchar **compressed,uint size)

{
  uchar *puVar1;
  undefined4 local_18;
  uint new_size;
  uint size_local;
  uchar **compressed_local;
  
  local_18 = size >> 3;
  if ((size & 7) != 0) {
    local_18 = local_18 + 1;
  }
  puVar1 = (uchar *)malloc((ulong)local_18);
  *compressed = puVar1;
  memset(*compressed,0,(ulong)local_18);
  return local_18;
}

Assistant:

unsigned RDL_bitset_init(unsigned char** compressed, unsigned size)
{
  unsigned new_size;

  new_size = size / BlockSize;
  if (size % BlockSize) {
    ++new_size;
  }

  *compressed = malloc(new_size * sizeof(**compressed));
  memset(*compressed, 0, new_size * sizeof(**compressed));

  return new_size;
}